

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecal.cpp
# Opt level: O1

int32_t icu_63::CECalendar::ceToJD(int32_t year,int32_t month,int32_t date,int32_t jdEpochOffset)

{
  int iVar1;
  uint uVar2;
  int32_t iVar3;
  int iVar4;
  int iVar5;
  
  if (month < 0) {
    iVar5 = month + 1;
    iVar1 = iVar5 >> 0x1f;
    iVar4 = iVar5 / 0xd + iVar1;
    uVar2 = (iVar4 - iVar1) - 1;
    iVar4 = iVar5 + (iVar4 - iVar1) * -0xd + 0xc;
  }
  else {
    uVar2 = (uint)month / 0xd;
    iVar4 = month - ((uint)month / 0xd + ((uint)month / 0xd) * 0xc);
  }
  iVar3 = ClockMath::floorDivide(uVar2 + year,4);
  return (uVar2 + year) * 0x16d + date + jdEpochOffset + iVar3 + iVar4 * 0x1e + -1;
}

Assistant:

int32_t
CECalendar::ceToJD(int32_t year, int32_t month, int32_t date, int32_t jdEpochOffset)
{
    // handle month > 12, < 0 (e.g. from add/set)
    if ( month >= 0 ) {
        year += month/13;
        month %= 13;
    } else {
        ++month;
        year += month/13 - 1;
        month = month%13 + 12;
    }
    return (int32_t) (
        jdEpochOffset                   // difference from Julian epoch to 1,1,1
        + 365 * year                    // number of days from years
        + ClockMath::floorDivide(year, 4)    // extra day of leap year
        + 30 * month                    // number of days from months (months are 0-based)
        + date - 1                      // number of days for present month (1 based)
        );
}